

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int gost_kimp15(uchar *expkey,size_t expkeylen,int cipher_nid,uchar *cipher_key,int mac_nid,
               uchar *mac_key,uchar *iv,size_t ivlen,uchar *shared_key)

{
  int iVar1;
  EVP_CIPHER_CTX *ctx;
  char *pcVar2;
  EVP_CIPHER *cipher;
  EVP_MD_CTX *ctx_00;
  EVP_MD *type;
  uchar *in_RCX;
  int in_EDX;
  ulong in_RSI;
  uchar *in_RDI;
  int in_R8D;
  void *in_stack_00000008;
  ulong in_stack_00000010;
  int len;
  int ret;
  EVP_MD_CTX *mac;
  EVP_CIPHER_CTX *ciph;
  size_t shared_len;
  uint mac_len;
  uchar mac_buf [16];
  uchar out [48];
  uchar iv_full [16];
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int function;
  uint local_b4;
  int local_b0;
  int local_ac;
  EVP_MD_CTX *local_a8;
  EVP_CIPHER_CTX *local_a0;
  undefined8 local_98;
  uint local_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  void *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  EVP_MD_CTX *in_stack_ffffffffffffffb8;
  
  local_98 = 0x20;
  local_a0 = (EVP_CIPHER_CTX *)0x0;
  local_a8 = (EVP_MD_CTX *)0x0;
  local_ac = 0;
  if (in_EDX == 0x4a4) {
    local_b4 = 8;
  }
  else {
    local_b4 = 0;
    if (in_EDX == 0x3f5) {
      local_b4 = 0x10;
    }
  }
  local_8c = local_b4;
  iVar1 = (int)in_stack_ffffffffffffff40;
  function = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (local_b4 == 0) {
    ERR_GOST_error(function,iVar1,in_stack_ffffffffffffff38,0);
  }
  else if (in_RSI < 0x31) {
    if (in_stack_00000010 < 0x11) {
      memset(&stack0xffffffffffffffb8,0,0x10);
      memcpy(&stack0xffffffffffffffb8,in_stack_00000008,in_stack_00000010);
      ctx = EVP_CIPHER_CTX_new();
      local_a0 = ctx;
      if (ctx == (EVP_CIPHER_CTX *)0x0) {
        ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
      }
      else {
        pcVar2 = OBJ_nid2sn(in_EDX);
        cipher = EVP_get_cipherbyname(pcVar2);
        iVar1 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,0);
        if ((((iVar1 < 1) ||
             (iVar1 = EVP_CipherInit_ex(local_a0,(EVP_CIPHER *)0x0,(ENGINE *)0x0,in_RCX,
                                        &stack0xffffffffffffffb8,0), iVar1 < 1)) ||
            (iVar1 = EVP_CipherUpdate(local_a0,(uchar *)&local_78,&local_b0,in_RDI,(int)in_RSI),
            iVar1 < 1)) ||
           (iVar1 = EVP_CipherFinal_ex(local_a0,(uchar *)((long)&local_78 + (long)local_b0),
                                       &local_b0), iVar1 < 1)) {
          ERR_GOST_error((int)((ulong)ctx >> 0x20),(int)ctx,in_stack_ffffffffffffff38,0);
        }
        else {
          ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          local_a8 = ctx_00;
          if (ctx_00 == (EVP_MD_CTX *)0x0) {
            ERR_GOST_error((int)((ulong)ctx >> 0x20),(int)ctx,in_stack_ffffffffffffff38,0);
          }
          else {
            pcVar2 = OBJ_nid2sn(in_R8D);
            type = EVP_get_digestbyname(pcVar2);
            iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
            if ((((iVar1 < 1) ||
                 (iVar1 = omac_imit_ctrl(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8),
                 iVar1 < 1)) ||
                ((iVar1 = omac_imit_ctrl(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8),
                 iVar1 < 1 ||
                 ((iVar1 = EVP_DigestUpdate(local_a8,in_stack_00000008,in_stack_00000010), iVar1 < 1
                  || (iVar1 = EVP_DigestUpdate(local_a8,&local_78,0x20), iVar1 < 1)))))) ||
               (iVar1 = EVP_DigestFinalXOF(local_a8,local_88,local_8c), iVar1 < 1)) {
              ERR_GOST_error((int)((ulong)ctx >> 0x20),(int)ctx,(char *)ctx_00,0);
            }
            else {
              iVar1 = CRYPTO_memcmp(local_88,&stack0xffffffffffffffa8,(ulong)local_8c);
              if (iVar1 == 0) {
                *_len = local_78;
                _len[1] = local_70;
                _len[2] = local_68;
                _len[3] = local_60;
                local_ac = 1;
              }
              else {
                ERR_GOST_error((int)((ulong)ctx >> 0x20),(int)ctx,(char *)ctx_00,0);
              }
            }
          }
        }
      }
    }
    else {
      ERR_GOST_error(function,iVar1,in_stack_ffffffffffffff38,0);
    }
  }
  else {
    ERR_GOST_error(function,iVar1,in_stack_ffffffffffffff38,0);
  }
  OPENSSL_cleanse(&local_78,0x30);
  EVP_MD_CTX_free(local_a8);
  EVP_CIPHER_CTX_free(local_a0);
  return local_ac;
}

Assistant:

int gost_kimp15(const unsigned char *expkey, const size_t expkeylen,
                int cipher_nid, const unsigned char *cipher_key,
                int mac_nid, unsigned char *mac_key,
                const unsigned char *iv, const size_t ivlen,
                unsigned char *shared_key)
{
    unsigned char iv_full[16], out[48], mac_buf[16];
    unsigned int mac_len;
    const size_t shared_len = 32;

    EVP_CIPHER_CTX *ciph = NULL;
    EVP_MD_CTX *mac = NULL;

    int ret = 0;
    int len;

    mac_len = (cipher_nid == NID_magma_ctr) ? 8 :
        (cipher_nid == NID_grasshopper_ctr) ? 16 : 0;

    if (mac_len == 0) {
        GOSTerr(GOST_F_GOST_KIMP15, GOST_R_INVALID_CIPHER);
        goto err;
    }

    if (expkeylen > sizeof(out)) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    if (ivlen > 16) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    /* we expect IV of half length */
    memset(iv_full, 0, 16);
    memcpy(iv_full, iv, ivlen);

    ciph = EVP_CIPHER_CTX_new();
    if (ciph == NULL) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_CipherInit_ex
        (ciph, EVP_get_cipherbynid(cipher_nid), NULL, NULL, NULL, 0) <= 0
        || EVP_CipherInit_ex(ciph, NULL, NULL, cipher_key, iv_full, 0) <= 0
        || EVP_CipherUpdate(ciph, out, &len, expkey, expkeylen) <= 0
        || EVP_CipherFinal_ex(ciph, out + len, &len) <= 0) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    /*Now we have shared key and mac in out[] */

    mac = EVP_MD_CTX_new();
    if (mac == NULL) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_DigestInit_ex(mac, EVP_get_digestbynid(mac_nid), NULL) <= 0
        || omac_imit_ctrl(mac, EVP_MD_CTRL_SET_KEY, 32, mac_key) <= 0
        || omac_imit_ctrl(mac, EVP_MD_CTRL_XOF_LEN, mac_len, NULL) <= 0
        || EVP_DigestUpdate(mac, iv, ivlen) <= 0
        || EVP_DigestUpdate(mac, out, shared_len) <= 0
        /* As we set MAC length directly, we should not allow overwriting it */
        || EVP_DigestFinalXOF(mac, mac_buf, mac_len) <= 0) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    if (CRYPTO_memcmp(mac_buf, out + shared_len, mac_len) != 0) {
        GOSTerr(GOST_F_GOST_KIMP15, GOST_R_BAD_MAC);
        goto err;
    }

    memcpy(shared_key, out, shared_len);
    ret = 1;

 err:
    OPENSSL_cleanse(out, sizeof(out));
    EVP_MD_CTX_free(mac);
    EVP_CIPHER_CTX_free(ciph);
    return ret;
}